

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O0

int __thiscall jrtplib::RTPAbortDescriptors::Init(RTPAbortDescriptors *this)

{
  int iVar1;
  RTPAbortDescriptors *this_local;
  
  if ((this->m_init & 1U) == 0) {
    iVar1 = pipe(this->m_descriptors);
    if (iVar1 < 0) {
      this_local._4_4_ = -0xb0;
    }
    else {
      this->m_init = true;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -0xad;
  }
  return this_local._4_4_;
}

Assistant:

int RTPAbortDescriptors::Init()
{
	if (m_init)
		return ERR_RTP_ABORTDESC_ALREADYINIT;

	if (pipe(m_descriptors) < 0)
		return ERR_RTP_ABORTDESC_CANTCREATEPIPE;

	m_init = true;
	return 0;
}